

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O0

string * __thiscall
util::make_string<char_const(&)[26],lzma_ret&,char_const(&)[2]>
          (string *__return_storage_ptr__,util *this,char (*args) [26],lzma_ret *args_1,
          char (*args_2) [2])

{
  ostringstream local_1a0 [8];
  ostringstream ss;
  char (*args_local_2) [2];
  lzma_ret *args_local_1;
  char (*args_local) [26];
  
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  std::operator<<((ostream *)local_1a0,(char *)this);
  std::ostream::operator<<(local_1a0,*(int *)*args);
  std::operator<<((ostream *)local_1a0,(char *)args_1);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

std::string make_string(Args&& ... args)
{
    std::ostringstream ss;
    (void)std::initializer_list<bool> {(ss << args, false)...};
    return ss.str();
}